

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void exprAnalyze(SrcList *pSrc,WhereClause *pWC,int idxTerm)

{
  byte bVar1;
  Parse *pParse_00;
  sqlite3 *db_00;
  long lVar2;
  char *pcVar3;
  WhereTerm *pWVar4;
  ushort uVar5;
  u16 uVar6;
  uint op_00;
  int iVar7;
  Bitmask BVar8;
  Expr *pEVar9;
  Expr *pEVar10;
  Expr *pEVar11;
  Bitmask BVar12;
  Expr *pNewExpr_1;
  Bitmask prereqExpr;
  Bitmask prereqColumn;
  WhereTerm *pNewTerm;
  Expr *pLeft_2;
  Expr *pRight_1;
  int idxNew_2;
  u8 *pC;
  undefined1 auStack_108 [7];
  u8 c;
  Token sCollSeqName;
  int idxNew2;
  int idxNew1;
  Expr *pNewExpr2;
  Expr *pNewExpr1;
  Expr *pStr2;
  Expr *pLeft_1;
  int idxNew_1;
  Expr *pNewExpr;
  int i;
  ExprList *pList;
  int idxNew;
  u16 eExtraOp;
  Expr *pDup;
  WhereTerm *pNew;
  u16 opMask;
  Expr *pRight;
  Expr *pLeft;
  Bitmask x;
  sqlite3 *db;
  Parse *pParse;
  int local_60;
  int op;
  int noCase;
  int isComplete;
  Expr *pStr1;
  Bitmask extraRight;
  Bitmask prereqAll;
  Bitmask prereqLeft;
  Expr *pExpr;
  WhereMaskSet *pMaskSet;
  WhereTerm *pTerm;
  WhereClause *pWStack_18;
  int idxTerm_local;
  WhereClause *pWC_local;
  SrcList *pSrc_local;
  
  pStr1 = (Expr *)0x0;
  _noCase = (Expr *)0x0;
  op = 0;
  local_60 = 0;
  pParse_00 = pWC->pParse;
  db_00 = pParse_00->db;
  if (db_00->mallocFailed != '\0') {
    return;
  }
  pMaskSet = (WhereMaskSet *)(pWC->a + idxTerm);
  pExpr = (Expr *)pWC->pMaskSet;
  prereqLeft = *(Bitmask *)pMaskSet;
  pTerm._4_4_ = idxTerm;
  pWStack_18 = pWC;
  pWC_local = (WhereClause *)pSrc;
  prereqAll = exprTableUsage((WhereMaskSet *)pExpr,*(Expr **)(prereqLeft + 0x10));
  op_00 = (uint)*(byte *)prereqLeft;
  if (op_00 == 0x48) {
    if ((*(ushort *)(prereqLeft + 2) & 0x800) == 0x800) {
      BVar8 = exprSelectTableUsage((WhereMaskSet *)pExpr,*(Select **)(prereqLeft + 0x20));
      *(Bitmask *)(pMaskSet->ix + 9) = BVar8;
    }
    else {
      BVar8 = exprListTableUsage((WhereMaskSet *)pExpr,*(ExprList **)(prereqLeft + 0x20));
      *(Bitmask *)(pMaskSet->ix + 9) = BVar8;
    }
  }
  else if (op_00 == 0x49) {
    pMaskSet->ix[9] = 0;
    pMaskSet->ix[10] = 0;
  }
  else {
    BVar8 = exprTableUsage((WhereMaskSet *)pExpr,*(Expr **)(prereqLeft + 0x18));
    *(Bitmask *)(pMaskSet->ix + 9) = BVar8;
  }
  extraRight = exprTableUsage((WhereMaskSet *)pExpr,(Expr *)prereqLeft);
  if ((*(ushort *)(prereqLeft + 2) & 1) == 1) {
    BVar8 = getMask((WhereMaskSet *)pExpr,(int)*(short *)(prereqLeft + 0x34));
    extraRight = BVar8 | extraRight;
    pStr1 = (Expr *)(BVar8 - 1);
  }
  *(Bitmask *)(pMaskSet->ix + 0xb) = extraRight;
  pMaskSet->ix[2] = -1;
  pMaskSet->ix[1] = -1;
  *(undefined2 *)(pMaskSet->ix + 5) = 0;
  iVar7 = allowedOp(op_00);
  if (iVar7 == 0) {
    if ((*(char *)prereqLeft == 'G') && (pWStack_18->op == 'E')) {
      lVar2 = *(long *)(prereqLeft + 0x20);
      for (pNewExpr._4_4_ = 0; pNewExpr._4_4_ < 2; pNewExpr._4_4_ = pNewExpr._4_4_ + 1) {
        bVar1 = "PN"[pNewExpr._4_4_];
        pEVar9 = sqlite3ExprDup(db_00,*(Expr **)(prereqLeft + 0x10),0);
        pEVar10 = sqlite3ExprDup(db_00,*(Expr **)(*(long *)(lVar2 + 8) + (long)pNewExpr._4_4_ * 0x20
                                                 ),0);
        pEVar9 = sqlite3PExpr(pParse_00,(uint)bVar1,pEVar9,pEVar10,(Token *)0x0);
        iVar7 = whereClauseInsert(pWStack_18,pEVar9,'\x03');
        exprAnalyze((SrcList *)pWC_local,pWStack_18,iVar7);
        pMaskSet = (WhereMaskSet *)(pWStack_18->a + pTerm._4_4_);
        pWStack_18->a[iVar7].iParent = pTerm._4_4_;
      }
      *(undefined1 *)((long)pMaskSet->ix + 0x17) = 2;
    }
    else if (*(char *)prereqLeft == 'D') {
      exprAnalyzeOrTerm((SrcList *)pWC_local,pWStack_18,pTerm._4_4_);
      pMaskSet = (WhereMaskSet *)(pWStack_18->a + pTerm._4_4_);
    }
  }
  else {
    pEVar9 = sqlite3ExprSkipCollate(*(Expr **)(prereqLeft + 0x10));
    pEVar10 = sqlite3ExprSkipCollate(*(Expr **)(prereqLeft + 0x18));
    uVar5 = 0x400;
    if ((*(ulong *)(pMaskSet->ix + 9) & prereqAll) == 0) {
      uVar5 = 0xfff;
    }
    if (pEVar9->op == 0x98) {
      pMaskSet->ix[2] = pEVar9->iTable;
      pMaskSet->ix[3] = (int)pEVar9->iColumn;
      uVar6 = operatorMask(op_00);
      *(u16 *)(pMaskSet->ix + 5) = uVar6 & uVar5;
    }
    if ((pEVar10 != (Expr *)0x0) && (pEVar10->op == 0x98)) {
      pList._6_2_ = 0;
      if (pMaskSet->ix[2] < 0) {
        _idxNew = (Expr *)prereqLeft;
        pDup = (Expr *)pMaskSet;
      }
      else {
        _idxNew = sqlite3ExprDup(db_00,(Expr *)prereqLeft,0);
        if (db_00->mallocFailed != '\0') {
          sqlite3ExprDelete(db_00,_idxNew);
          return;
        }
        iVar7 = whereClauseInsert(pWStack_18,_idxNew,'\x03');
        if (iVar7 == 0) {
          return;
        }
        pDup = (Expr *)(pWStack_18->a + iVar7);
        (pDup->u).iValue = pTerm._4_4_;
        pMaskSet = (WhereMaskSet *)(pWStack_18->a + pTerm._4_4_);
        *(undefined1 *)((long)pMaskSet->ix + 0x17) = 1;
        *(byte *)((long)pMaskSet->ix + 0x16) = *(byte *)((long)pMaskSet->ix + 0x16) | 8;
        if (((*(char *)prereqLeft == 'L') && ((*(ushort *)(prereqLeft + 2) & 1) != 1)) &&
           ((db_00->dbOptFlags & 0x200) == 0)) {
          *(ushort *)(pMaskSet->ix + 5) = (ushort)pMaskSet->ix[5] | 0x400;
          pList._6_2_ = 0x400;
        }
      }
      exprCommute(pParse_00,_idxNew);
      pEVar9 = sqlite3ExprSkipCollate(_idxNew->pLeft);
      *(int *)((long)&pDup->u + 4) = pEVar9->iTable;
      *(int *)&pDup->pLeft = (int)pEVar9->iColumn;
      pDup->nHeight = (int)(prereqAll | (ulong)pStr1);
      pDup->iTable = (int)((prereqAll | (ulong)pStr1) >> 0x20);
      pDup->iColumn = (undefined2)extraRight;
      pDup->iAgg = extraRight._2_2_;
      pDup->iRightJoinTable = extraRight._4_2_;
      pDup->flags2 = extraRight._6_1_;
      pDup->op2 = extraRight._7_1_;
      uVar6 = operatorMask((uint)_idxNew->op);
      *(u16 *)&pDup->pRight = uVar6 + pList._6_2_ & uVar5;
    }
  }
  if ((pWStack_18->op == 'E') &&
     (iVar7 = isLikeOrGlob(pParse_00,(Expr *)prereqLeft,(Expr **)&noCase,&op,&local_60), iVar7 != 0)
     ) {
    pEVar9 = *(Expr **)(*(long *)(*(long *)(prereqLeft + 0x20) + 8) + 0x20);
    pEVar10 = sqlite3ExprDup(db_00,_noCase,0);
    if (db_00->mallocFailed == '\0') {
      pcVar3 = (pEVar10->u).zToken;
      iVar7 = sqlite3Strlen30((pEVar10->u).zToken);
      pC._7_1_ = pcVar3[iVar7 + -1];
      if (local_60 != 0) {
        if (pC._7_1_ == 0x40) {
          op = 0;
        }
        pC._7_1_ = ""[pC._7_1_];
      }
      pcVar3[iVar7 + -1] = pC._7_1_ + 1;
    }
    _auStack_108 = "BINARY";
    if (local_60 != 0) {
      _auStack_108 = "NOCASE";
    }
    sCollSeqName.z._0_4_ = 6;
    pEVar11 = sqlite3ExprDup(db_00,pEVar9,0);
    pEVar11 = sqlite3ExprAddCollateToken(pParse_00,pEVar11,(Token *)auStack_108);
    pEVar11 = sqlite3PExpr(pParse_00,0x50,pEVar11,_noCase,(Token *)0x0);
    sCollSeqName._12_4_ = whereClauseInsert(pWStack_18,pEVar11,'\x03');
    exprAnalyze((SrcList *)pWC_local,pWStack_18,sCollSeqName._12_4_);
    pEVar9 = sqlite3ExprDup(db_00,pEVar9,0);
    pEVar9 = sqlite3ExprAddCollateToken(pParse_00,pEVar9,(Token *)auStack_108);
    pEVar9 = sqlite3PExpr(pParse_00,0x4f,pEVar9,pEVar10,(Token *)0x0);
    sCollSeqName.n = whereClauseInsert(pWStack_18,pEVar9,'\x03');
    exprAnalyze((SrcList *)pWC_local,pWStack_18,sCollSeqName.n);
    pMaskSet = (WhereMaskSet *)(pWStack_18->a + pTerm._4_4_);
    if (op != 0) {
      pWStack_18->a[(int)sCollSeqName._12_4_].iParent = pTerm._4_4_;
      pWStack_18->a[(int)sCollSeqName.n].iParent = pTerm._4_4_;
      *(undefined1 *)((long)pMaskSet->ix + 0x17) = 2;
    }
  }
  iVar7 = isMatchOfColumn((Expr *)prereqLeft);
  if (iVar7 != 0) {
    pEVar9 = (Expr *)**(undefined8 **)(*(long *)(prereqLeft + 0x20) + 8);
    pEVar10 = *(Expr **)(*(long *)(*(long *)(prereqLeft + 0x20) + 8) + 0x20);
    BVar8 = exprTableUsage((WhereMaskSet *)pExpr,pEVar9);
    BVar12 = exprTableUsage((WhereMaskSet *)pExpr,pEVar10);
    if ((BVar8 & BVar12) == 0) {
      pEVar9 = sqlite3ExprDup(db_00,pEVar9,0);
      pEVar9 = sqlite3PExpr(pParse_00,0x32,(Expr *)0x0,pEVar9,(Token *)0x0);
      iVar7 = whereClauseInsert(pWStack_18,pEVar9,'\x03');
      pWVar4 = pWStack_18->a;
      pWVar4[iVar7].prereqRight = BVar8;
      pWVar4[iVar7].leftCursor = pEVar10->iTable;
      *(int *)&pWVar4[iVar7].u = (int)pEVar10->iColumn;
      pWVar4[iVar7].eOperator = 0x40;
      pWVar4[iVar7].iParent = pTerm._4_4_;
      pMaskSet = (WhereMaskSet *)(pWStack_18->a + pTerm._4_4_);
      *(undefined1 *)((long)pMaskSet->ix + 0x17) = 1;
      *(byte *)((long)pMaskSet->ix + 0x16) = *(byte *)((long)pMaskSet->ix + 0x16) | 8;
      pWVar4[iVar7].prereqAll = *(Bitmask *)(pMaskSet->ix + 0xb);
    }
  }
  *(ulong *)(pMaskSet->ix + 9) = (ulong)pStr1 | *(ulong *)(pMaskSet->ix + 9);
  return;
}

Assistant:

static void exprAnalyze(
  SrcList *pSrc,            /* the FROM clause */
  WhereClause *pWC,         /* the WHERE clause */
  int idxTerm               /* Index of the term to be analyzed */
){
  WhereTerm *pTerm;                /* The term to be analyzed */
  WhereMaskSet *pMaskSet;          /* Set of table index masks */
  Expr *pExpr;                     /* The expression to be analyzed */
  Bitmask prereqLeft;              /* Prerequesites of the pExpr->pLeft */
  Bitmask prereqAll;               /* Prerequesites of pExpr */
  Bitmask extraRight = 0;          /* Extra dependencies on LEFT JOIN */
  Expr *pStr1 = 0;                 /* RHS of LIKE/GLOB operator */
  int isComplete = 0;              /* RHS of LIKE/GLOB ends with wildcard */
  int noCase = 0;                  /* LIKE/GLOB distinguishes case */
  int op;                          /* Top-level operator.  pExpr->op */
  Parse *pParse = pWC->pParse;     /* Parsing context */
  sqlite3 *db = pParse->db;        /* Database connection */

  if( db->mallocFailed ){
    return;
  }
  pTerm = &pWC->a[idxTerm];
  pMaskSet = pWC->pMaskSet;
  pExpr = pTerm->pExpr;
  assert( pExpr->op!=TK_AS && pExpr->op!=TK_COLLATE );
  prereqLeft = exprTableUsage(pMaskSet, pExpr->pLeft);
  op = pExpr->op;
  if( op==TK_IN ){
    assert( pExpr->pRight==0 );
    if( ExprHasProperty(pExpr, EP_xIsSelect) ){
      pTerm->prereqRight = exprSelectTableUsage(pMaskSet, pExpr->x.pSelect);
    }else{
      pTerm->prereqRight = exprListTableUsage(pMaskSet, pExpr->x.pList);
    }
  }else if( op==TK_ISNULL ){
    pTerm->prereqRight = 0;
  }else{
    pTerm->prereqRight = exprTableUsage(pMaskSet, pExpr->pRight);
  }
  prereqAll = exprTableUsage(pMaskSet, pExpr);
  if( ExprHasProperty(pExpr, EP_FromJoin) ){
    Bitmask x = getMask(pMaskSet, pExpr->iRightJoinTable);
    prereqAll |= x;
    extraRight = x-1;  /* ON clause terms may not be used with an index
                       ** on left table of a LEFT JOIN.  Ticket #3015 */
  }
  pTerm->prereqAll = prereqAll;
  pTerm->leftCursor = -1;
  pTerm->iParent = -1;
  pTerm->eOperator = 0;
  if( allowedOp(op) ){
    Expr *pLeft = sqlite3ExprSkipCollate(pExpr->pLeft);
    Expr *pRight = sqlite3ExprSkipCollate(pExpr->pRight);
    u16 opMask = (pTerm->prereqRight & prereqLeft)==0 ? WO_ALL : WO_EQUIV;
    if( pLeft->op==TK_COLUMN ){
      pTerm->leftCursor = pLeft->iTable;
      pTerm->u.leftColumn = pLeft->iColumn;
      pTerm->eOperator = operatorMask(op) & opMask;
    }
    if( pRight && pRight->op==TK_COLUMN ){
      WhereTerm *pNew;
      Expr *pDup;
      u16 eExtraOp = 0;        /* Extra bits for pNew->eOperator */
      if( pTerm->leftCursor>=0 ){
        int idxNew;
        pDup = sqlite3ExprDup(db, pExpr, 0);
        if( db->mallocFailed ){
          sqlite3ExprDelete(db, pDup);
          return;
        }
        idxNew = whereClauseInsert(pWC, pDup, TERM_VIRTUAL|TERM_DYNAMIC);
        if( idxNew==0 ) return;
        pNew = &pWC->a[idxNew];
        pNew->iParent = idxTerm;
        pTerm = &pWC->a[idxTerm];
        pTerm->nChild = 1;
        pTerm->wtFlags |= TERM_COPIED;
        if( pExpr->op==TK_EQ
         && !ExprHasProperty(pExpr, EP_FromJoin)
         && OptimizationEnabled(db, SQLITE_Transitive)
        ){
          pTerm->eOperator |= WO_EQUIV;
          eExtraOp = WO_EQUIV;
        }
      }else{
        pDup = pExpr;
        pNew = pTerm;
      }
      exprCommute(pParse, pDup);
      pLeft = sqlite3ExprSkipCollate(pDup->pLeft);
      pNew->leftCursor = pLeft->iTable;
      pNew->u.leftColumn = pLeft->iColumn;
      testcase( (prereqLeft | extraRight) != prereqLeft );
      pNew->prereqRight = prereqLeft | extraRight;
      pNew->prereqAll = prereqAll;
      pNew->eOperator = (operatorMask(pDup->op) + eExtraOp) & opMask;
    }
  }

#ifndef SQLITE_OMIT_BETWEEN_OPTIMIZATION
  /* If a term is the BETWEEN operator, create two new virtual terms
  ** that define the range that the BETWEEN implements.  For example:
  **
  **      a BETWEEN b AND c
  **
  ** is converted into:
  **
  **      (a BETWEEN b AND c) AND (a>=b) AND (a<=c)
  **
  ** The two new terms are added onto the end of the WhereClause object.
  ** The new terms are "dynamic" and are children of the original BETWEEN
  ** term.  That means that if the BETWEEN term is coded, the children are
  ** skipped.  Or, if the children are satisfied by an index, the original
  ** BETWEEN term is skipped.
  */
  else if( pExpr->op==TK_BETWEEN && pWC->op==TK_AND ){
    ExprList *pList = pExpr->x.pList;
    int i;
    static const u8 ops[] = {TK_GE, TK_LE};
    assert( pList!=0 );
    assert( pList->nExpr==2 );
    for(i=0; i<2; i++){
      Expr *pNewExpr;
      int idxNew;
      pNewExpr = sqlite3PExpr(pParse, ops[i], 
                             sqlite3ExprDup(db, pExpr->pLeft, 0),
                             sqlite3ExprDup(db, pList->a[i].pExpr, 0), 0);
      idxNew = whereClauseInsert(pWC, pNewExpr, TERM_VIRTUAL|TERM_DYNAMIC);
      testcase( idxNew==0 );
      exprAnalyze(pSrc, pWC, idxNew);
      pTerm = &pWC->a[idxTerm];
      pWC->a[idxNew].iParent = idxTerm;
    }
    pTerm->nChild = 2;
  }
#endif /* SQLITE_OMIT_BETWEEN_OPTIMIZATION */

#if !defined(SQLITE_OMIT_OR_OPTIMIZATION) && !defined(SQLITE_OMIT_SUBQUERY)
  /* Analyze a term that is composed of two or more subterms connected by
  ** an OR operator.
  */
  else if( pExpr->op==TK_OR ){
    assert( pWC->op==TK_AND );
    exprAnalyzeOrTerm(pSrc, pWC, idxTerm);
    pTerm = &pWC->a[idxTerm];
  }
#endif /* SQLITE_OMIT_OR_OPTIMIZATION */

#ifndef SQLITE_OMIT_LIKE_OPTIMIZATION
  /* Add constraints to reduce the search space on a LIKE or GLOB
  ** operator.
  **
  ** A like pattern of the form "x LIKE 'abc%'" is changed into constraints
  **
  **          x>='abc' AND x<'abd' AND x LIKE 'abc%'
  **
  ** The last character of the prefix "abc" is incremented to form the
  ** termination condition "abd".
  */
  if( pWC->op==TK_AND 
   && isLikeOrGlob(pParse, pExpr, &pStr1, &isComplete, &noCase)
  ){
    Expr *pLeft;       /* LHS of LIKE/GLOB operator */
    Expr *pStr2;       /* Copy of pStr1 - RHS of LIKE/GLOB operator */
    Expr *pNewExpr1;
    Expr *pNewExpr2;
    int idxNew1;
    int idxNew2;
    Token sCollSeqName;  /* Name of collating sequence */

    pLeft = pExpr->x.pList->a[1].pExpr;
    pStr2 = sqlite3ExprDup(db, pStr1, 0);
    if( !db->mallocFailed ){
      u8 c, *pC;       /* Last character before the first wildcard */
      pC = (u8*)&pStr2->u.zToken[sqlite3Strlen30(pStr2->u.zToken)-1];
      c = *pC;
      if( noCase ){
        /* The point is to increment the last character before the first
        ** wildcard.  But if we increment '@', that will push it into the
        ** alphabetic range where case conversions will mess up the 
        ** inequality.  To avoid this, make sure to also run the full
        ** LIKE on all candidate expressions by clearing the isComplete flag
        */
        if( c=='A'-1 ) isComplete = 0;   /* EV: R-64339-08207 */


        c = sqlite3UpperToLower[c];
      }
      *pC = c + 1;
    }
    sCollSeqName.z = noCase ? "NOCASE" : "BINARY";
    sCollSeqName.n = 6;
    pNewExpr1 = sqlite3ExprDup(db, pLeft, 0);
    pNewExpr1 = sqlite3PExpr(pParse, TK_GE, 
           sqlite3ExprAddCollateToken(pParse,pNewExpr1,&sCollSeqName),
           pStr1, 0);
    idxNew1 = whereClauseInsert(pWC, pNewExpr1, TERM_VIRTUAL|TERM_DYNAMIC);
    testcase( idxNew1==0 );
    exprAnalyze(pSrc, pWC, idxNew1);
    pNewExpr2 = sqlite3ExprDup(db, pLeft, 0);
    pNewExpr2 = sqlite3PExpr(pParse, TK_LT,
           sqlite3ExprAddCollateToken(pParse,pNewExpr2,&sCollSeqName),
           pStr2, 0);
    idxNew2 = whereClauseInsert(pWC, pNewExpr2, TERM_VIRTUAL|TERM_DYNAMIC);
    testcase( idxNew2==0 );
    exprAnalyze(pSrc, pWC, idxNew2);
    pTerm = &pWC->a[idxTerm];
    if( isComplete ){
      pWC->a[idxNew1].iParent = idxTerm;
      pWC->a[idxNew2].iParent = idxTerm;
      pTerm->nChild = 2;
    }
  }
#endif /* SQLITE_OMIT_LIKE_OPTIMIZATION */

#ifndef SQLITE_OMIT_VIRTUALTABLE
  /* Add a WO_MATCH auxiliary term to the constraint set if the
  ** current expression is of the form:  column MATCH expr.
  ** This information is used by the xBestIndex methods of
  ** virtual tables.  The native query optimizer does not attempt
  ** to do anything with MATCH functions.
  */
  if( isMatchOfColumn(pExpr) ){
    int idxNew;
    Expr *pRight, *pLeft;
    WhereTerm *pNewTerm;
    Bitmask prereqColumn, prereqExpr;

    pRight = pExpr->x.pList->a[0].pExpr;
    pLeft = pExpr->x.pList->a[1].pExpr;
    prereqExpr = exprTableUsage(pMaskSet, pRight);
    prereqColumn = exprTableUsage(pMaskSet, pLeft);
    if( (prereqExpr & prereqColumn)==0 ){
      Expr *pNewExpr;
      pNewExpr = sqlite3PExpr(pParse, TK_MATCH, 
                              0, sqlite3ExprDup(db, pRight, 0), 0);
      idxNew = whereClauseInsert(pWC, pNewExpr, TERM_VIRTUAL|TERM_DYNAMIC);
      testcase( idxNew==0 );
      pNewTerm = &pWC->a[idxNew];
      pNewTerm->prereqRight = prereqExpr;
      pNewTerm->leftCursor = pLeft->iTable;
      pNewTerm->u.leftColumn = pLeft->iColumn;
      pNewTerm->eOperator = WO_MATCH;
      pNewTerm->iParent = idxTerm;
      pTerm = &pWC->a[idxTerm];
      pTerm->nChild = 1;
      pTerm->wtFlags |= TERM_COPIED;
      pNewTerm->prereqAll = pTerm->prereqAll;
    }
  }
#endif /* SQLITE_OMIT_VIRTUALTABLE */

#ifdef SQLITE_ENABLE_STAT3
  /* When sqlite_stat3 histogram data is available an operator of the
  ** form "x IS NOT NULL" can sometimes be evaluated more efficiently
  ** as "x>NULL" if x is not an INTEGER PRIMARY KEY.  So construct a
  ** virtual term of that form.
  **
  ** Note that the virtual term must be tagged with TERM_VNULL.  This
  ** TERM_VNULL tag will suppress the not-null check at the beginning
  ** of the loop.  Without the TERM_VNULL flag, the not-null check at
  ** the start of the loop will prevent any results from being returned.
  */
  if( pExpr->op==TK_NOTNULL
   && pExpr->pLeft->op==TK_COLUMN
   && pExpr->pLeft->iColumn>=0
  ){
    Expr *pNewExpr;
    Expr *pLeft = pExpr->pLeft;
    int idxNew;
    WhereTerm *pNewTerm;

    pNewExpr = sqlite3PExpr(pParse, TK_GT,
                            sqlite3ExprDup(db, pLeft, 0),
                            sqlite3PExpr(pParse, TK_NULL, 0, 0, 0), 0);

    idxNew = whereClauseInsert(pWC, pNewExpr,
                              TERM_VIRTUAL|TERM_DYNAMIC|TERM_VNULL);
    if( idxNew ){
      pNewTerm = &pWC->a[idxNew];
      pNewTerm->prereqRight = 0;
      pNewTerm->leftCursor = pLeft->iTable;
      pNewTerm->u.leftColumn = pLeft->iColumn;
      pNewTerm->eOperator = WO_GT;
      pNewTerm->iParent = idxTerm;
      pTerm = &pWC->a[idxTerm];
      pTerm->nChild = 1;
      pTerm->wtFlags |= TERM_COPIED;
      pNewTerm->prereqAll = pTerm->prereqAll;
    }
  }
#endif /* SQLITE_ENABLE_STAT */

  /* Prevent ON clause terms of a LEFT JOIN from being used to drive
  ** an index for tables to the left of the join.
  */
  pTerm->prereqRight |= extraRight;
}